

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O0

shared_ptr<Voxelizer>
Voxelizer::Create(shared_ptr<Scene> *scene,shared_ptr<myvk::CommandPool> *command_pool,
                 uint32_t octree_level)

{
  uint32_t uVar1;
  element_type *peVar2;
  element_type *this;
  element_type *peVar3;
  uint32_t in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<Voxelizer> sVar5;
  uint32_t in_stack_00000014;
  VkExtent2D *in_stack_00000018;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *in_stack_00000020;
  Ptr<RenderPass> *in_stack_00000028;
  shared_ptr<myvk::Device> device;
  Voxelizer *in_stack_000000b0;
  shared_ptr<Voxelizer> *ret;
  shared_ptr<myvk::CommandPool> *in_stack_00000128;
  Voxelizer *in_stack_00000130;
  shared_ptr<myvk::Device> *in_stack_00005158;
  Voxelizer *in_stack_00005160;
  shared_ptr<Scene> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  PhysicalDevice *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  element_type *this_01;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  local_98;
  shared_ptr<myvk::Framebuffer> local_78;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffff98;
  Voxelizer *in_stack_ffffffffffffffa0;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffffa8;
  Counter *in_stack_ffffffffffffffb0;
  allocator<char> local_41 [35];
  undefined1 local_1e;
  byte local_1d;
  uint32_t local_1c;
  
  local_1d = 0;
  this_01 = in_RDI;
  local_1c = in_ECX;
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15b1f8);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x15b20c);
  myvk::Device::GetPhysicalDevicePtr(this);
  std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15b21c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (allocator<char> *)in_stack_ffffffffffffff30);
  local_1e = myvk::PhysicalDevice::GetExtensionSupport
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::make_shared<Voxelizer,bool>((bool *)in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  std::allocator<char>::~allocator(local_41);
  uVar1 = local_1c;
  peVar3 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x15b2ba);
  peVar3->m_level = uVar1;
  uVar1 = 1 << ((byte)local_1c & 0x1f);
  peVar3 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x15b2e0);
  peVar3->m_voxel_resolution = uVar1;
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b301);
  std::shared_ptr<Scene>::operator=
            ((shared_ptr<Scene> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  peVar2 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15b31f);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::shared_ptr<myvk::Device>::shared_ptr
            ((shared_ptr<myvk::Device> *)in_stack_ffffffffffffff00,
             (shared_ptr<myvk::Device> *)in_stack_fffffffffffffef8);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b353);
  Counter::Initialize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b370);
  create_descriptors(in_stack_000000b0,
                     (shared_ptr<myvk::Device> *)
                     device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b38c);
  create_render_pass(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b3a8);
  create_pipeline(in_stack_00005160,in_stack_00005158);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b3c4);
  local_98.
  super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &local_98;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::vector((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
            *)0x15b3f0);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b3fa);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b40e);
  myvk::Framebuffer::Create(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014)
  ;
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b446);
  std::shared_ptr<myvk::Framebuffer>::operator=
            (&local_78,(shared_ptr<myvk::Framebuffer> *)in_stack_fffffffffffffef8);
  std::shared_ptr<myvk::Framebuffer>::~shared_ptr((shared_ptr<myvk::Framebuffer> *)0x15b469);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector(this_00);
  std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15b47d);
  count_and_create_fragment_list(in_stack_00000130,in_stack_00000128);
  local_1d = 1;
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x15b4a4);
  _Var4._M_pi = extraout_RDX;
  if ((local_1d & 1) == 0) {
    std::shared_ptr<Voxelizer>::~shared_ptr((shared_ptr<Voxelizer> *)0x15b560);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Voxelizer>)sVar5.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Voxelizer> Voxelizer::Create(const std::shared_ptr<Scene> &scene,
                                             const std::shared_ptr<myvk::CommandPool> &command_pool,
                                             uint32_t octree_level) {
	std::shared_ptr<Voxelizer> ret =
	    std::make_shared<Voxelizer>(command_pool->GetDevicePtr()->GetPhysicalDevicePtr()->GetExtensionSupport(
	        VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME));

	ret->m_level = octree_level;
	ret->m_voxel_resolution = 1u << octree_level;
	ret->m_scene_ptr = scene;

	std::shared_ptr<myvk::Device> device = command_pool->GetDevicePtr();
	ret->m_atomic_counter.Initialize(device);
	ret->create_descriptors(device);
	ret->create_render_pass(device);
	ret->create_pipeline(device);
	ret->m_framebuffer =
	    myvk::Framebuffer::Create(ret->m_render_pass, {}, {ret->m_voxel_resolution, ret->m_voxel_resolution});
	ret->count_and_create_fragment_list(command_pool);

	return ret;
}